

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O0

long computeDifferences(char *s1,char *s2,unsigned_long L,char matchMode,Vector *result,
                       sequence_gap_structure *sequence_descriptor1,
                       sequence_gap_structure *sequence_descriptor2)

{
  uint uVar1;
  uint alt;
  unsigned_long uVar2;
  char in_CL;
  long in_RSI;
  long in_RDI;
  Vector *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  uint c2_1;
  uint c1_1;
  long p_1;
  uint c2;
  uint c1;
  long p;
  unsigned_long last_nongap;
  unsigned_long first_nongap;
  long in_stack_ffffffffffffff88;
  Vector *l;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *local_68;
  Vector *local_58;
  Vector *local_48;
  
  if ((in_R9 != (long *)0x0) && (in_stack_00000008 != (long *)0x0)) {
    if (*in_R9 < *in_stack_00000008) {
      local_68 = (Vector *)*in_R9;
    }
    else {
      local_68 = (Vector *)*in_stack_00000008;
    }
    if (in_stack_00000008[1] < in_R9[1]) {
      pVVar3 = (Vector *)in_R9[1];
    }
    else {
      pVVar3 = (Vector *)in_stack_00000008[1];
    }
    if (in_CL == '\x06') {
      pVVar4 = pVVar3;
      for (local_48 = local_68; local_48 < pVVar3; local_48 = (Vector *)((long)&local_48->vData + 1)
          ) {
        uVar1 = (uint)*(char *)((long)&local_48->vData + in_RDI);
        alt = (uint)*(char *)((long)&local_48->vData + in_RSI);
        if (((uVar1 != alt) && (alt != 0xf)) && (uVar1 != 0xf)) {
          l = in_R8;
          pack_difference((long)local_48,alt);
          Vector::appendValue(pVVar4,(long)l);
        }
      }
    }
    else if (in_CL == '\x05') {
      pVVar4 = pVVar3;
      for (local_58 = local_68; local_58 < pVVar3; local_58 = (Vector *)((long)&local_58->vData + 1)
          ) {
        uVar1 = (uint)*(char *)((long)&local_58->vData + in_RSI);
        if ((int)*(char *)((long)&local_58->vData + in_RDI) != uVar1) {
          pack_difference((long)local_58,uVar1);
          Vector::appendValue(pVVar4,in_stack_ffffffffffffff88);
        }
      }
    }
  }
  uVar2 = Vector::length(in_R8);
  return uVar2;
}

Assistant:

long        computeDifferences (const char * __restrict__ s1,
                                const char * __restrict__ s2,
                                const unsigned long L,
                                const char matchMode,
                                Vector & result,
                                const sequence_gap_structure * sequence_descriptor1,
                                const sequence_gap_structure * sequence_descriptor2) {
    

    if (sequence_descriptor1 && sequence_descriptor2) {
      
      unsigned long first_nongap = MIN  (sequence_descriptor1->first_nongap,   sequence_descriptor2->first_nongap),
                    last_nongap  = MAX  (sequence_descriptor1->last_nongap,    sequence_descriptor2->last_nongap);
//#pragma omp critical
//      cout << first_nongap << " " << last_nongap << " " << span_start << " " << span_end << endl;
        
      if (matchMode == INFORMATIVE) {
          for (long p = first_nongap; p < last_nongap; p++) {
              unsigned c1 = s1[p],
                       c2 = s2[p];
              
              if (c1 != c2) {
                  if (c2 != N_CHAR && c1 != N_CHAR) {
                      result.appendValue(pack_difference(p,c2));
                  }
              }
          }
      } else if (matchMode == MISMATCH) {
          for (long p = first_nongap; p < last_nongap; p++) {
              unsigned c1 = s1[p],
                       c2 = s2[p];
              
              if (c1 != c2) {
                  result.appendValue(pack_difference(p,c2));
              }
          }
      }
    }
    
    return result.length();
}